

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

int __thiscall
cmCTest::Run(cmCTest *this,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *args,string *output)

{
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var1;
  pointer pbVar2;
  pointer pcVar3;
  pointer ppcVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  pointer ppcVar11;
  uint uVar12;
  bool bVar13;
  initializer_list<cmCTestGenericHandler_*> __l;
  bool SRArgumentSpecified;
  string arg;
  string errormsg;
  string targ;
  bool local_249;
  size_t local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_240;
  uint local_234;
  uint local_230;
  uint local_22c;
  long *local_228 [2];
  long local_218 [2];
  string local_208;
  vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> local_1e8;
  long *local_1d0 [2];
  long local_1c0 [2];
  string *local_1b0;
  string local_1a8;
  cmCTestTestHandler *local_188;
  cmCTestUpdateHandler *local_180;
  cmCTestConfigureHandler *local_178;
  cmCTestMemCheckHandler *local_170;
  cmCTestSubmitHandler *local_168;
  cmCTestUploadHandler *local_160;
  ios_base local_138 [264];
  
  local_249 = false;
  _Var1._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(_Var1._M_head_impl)->InitialCommandLineArguments,
             ((_Var1._M_head_impl)->InitialCommandLineArguments).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  local_248 = 1;
  uVar9 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  bVar13 = uVar9 >= 0x21;
  if (uVar9 < 0x21) {
    uVar10 = 1;
    uVar12 = 0;
  }
  else {
    local_234 = (uint)CONCAT71((int7)(uVar9 >> 8),1);
    local_230 = 0;
    local_240 = args;
    local_1b0 = output;
    do {
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      local_208._M_string_length = 0;
      local_208.field_2._M_local_buf[0] = '\0';
      bVar5 = HandleCommandLineArguments(this,&local_248,local_240,&local_208);
      if (bVar5) {
        HandleScriptArguments(this,&local_248,local_240,&local_249);
        pbVar2 = (local_240->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pcVar3 = pbVar2[local_248]._M_dataplus._M_p;
        local_228[0] = local_218;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_228,pcVar3,pcVar3 + pbVar2[local_248]._M_string_length);
        iVar7 = std::__cxx11::string::compare((char *)local_228);
        if (((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)local_228), iVar7 == 0))
           && (pbVar2 = (local_240->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,
              local_248 <
              ((long)(local_240->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U)) {
          ((this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ProduceXML = true;
          local_248 = local_248 + 1;
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          pcVar3 = pbVar2[local_248]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1a8,pcVar3,pcVar3 + pbVar2[local_248]._M_string_length);
          bVar5 = AddTestsForDashboardType(this,&local_1a8);
          if ((!bVar5) && (bVar5 = AddVariableDefinition(this,&local_1a8), !bVar5)) {
            ErrorMessageUnknownDashDValue(this,&local_1a8);
            local_234 = 0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,
                            (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
          }
        }
        iVar7 = std::__cxx11::string::compare((char *)local_228);
        if ((iVar7 != 0) &&
           (bVar5 = cmsys::SystemTools::StringStartsWith((char *)local_228[0],"-D"), bVar5)) {
          std::__cxx11::string::substr((ulong)&local_1a8,(ulong)local_228);
          AddVariableDefinition(this,&local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,
                            (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
          }
        }
        bVar5 = HandleTestActionArgument(this,"ctest",&local_248,local_240);
        bVar6 = HandleTestModelArgument(this,"ctest",&local_248,local_240);
        local_234 = local_234 & 0xff;
        if (!bVar6) {
          local_234 = 0;
        }
        if (!bVar5) {
          local_234 = 0;
        }
        iVar7 = std::__cxx11::string::compare((char *)local_228);
        if ((iVar7 == 0) &&
           (local_248 <
            ((long)(local_240->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_240->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
          ((this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ProduceXML = true;
          SetTest(this,"Submit",true);
          local_248 = local_248 + 1;
          bVar6 = SubmitExtraFiles(this,(local_240->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start[local_248].
                                        _M_dataplus._M_p);
          bVar5 = false;
          if (bVar6) goto LAB_001518d1;
          local_22c = 0;
        }
        else {
LAB_001518d1:
          iVar7 = std::__cxx11::string::compare((char *)local_228);
          if ((iVar7 == 0) &&
             (local_230 = local_230 & 0xff,
             local_248 <
             ((long)(local_240->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(local_240->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
            local_230 = 1;
          }
          iVar7 = std::__cxx11::string::compare((char *)local_228);
          if (iVar7 == 0) {
            _Var1._M_head_impl =
                 (this->Impl)._M_t.
                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
                 super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
            std::__cxx11::string::_M_replace
                      ((ulong)&(_Var1._M_head_impl)->ScheduleType,0,
                       (char *)((_Var1._M_head_impl)->ScheduleType)._M_string_length,0x59dfda);
          }
          _Var1._M_head_impl =
               (this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
          local_1a8._M_dataplus._M_p = (pointer)&(_Var1._M_head_impl)->BuildHandler;
          local_1a8._M_string_length = (size_type)&(_Var1._M_head_impl)->BuildAndTestHandler;
          local_1a8.field_2._M_allocated_capacity =
               (size_type)&(_Var1._M_head_impl)->CoverageHandler;
          local_1a8.field_2._8_8_ = &(_Var1._M_head_impl)->ScriptHandler;
          local_188 = &(_Var1._M_head_impl)->TestHandler;
          local_180 = &(_Var1._M_head_impl)->UpdateHandler;
          local_178 = &(_Var1._M_head_impl)->ConfigureHandler;
          local_170 = &(_Var1._M_head_impl)->MemCheckHandler;
          local_168 = &(_Var1._M_head_impl)->SubmitHandler;
          local_160 = &(_Var1._M_head_impl)->UploadHandler;
          __l._M_len = 10;
          __l._M_array = (iterator)&local_1a8;
          std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::vector
                    (&local_1e8,__l,(allocator_type *)local_1d0);
          ppcVar4 = local_1e8.
                    super__Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (ppcVar11 = local_1e8.
                          super__Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; bVar5 = ppcVar11 == ppcVar4,
              !bVar5; ppcVar11 = ppcVar11 + 1) {
            iVar7 = (*(*ppcVar11)->_vptr_cmCTestGenericHandler[2])
                              (*ppcVar11,local_228,&local_248,local_240);
            if (iVar7 == 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,
                         "Problem parsing command line arguments within a handler",0x37);
              std::__cxx11::stringbuf::str();
              Log(this,7,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
                  ,0x8e2,(char *)local_1d0[0],false);
              if (local_1d0[0] != local_1c0) {
                operator_delete(local_1d0[0],local_1c0[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
              std::ios_base::~ios_base(local_138);
              local_22c = 0;
            }
            if (iVar7 == 0) break;
          }
          if (local_1e8.
              super__Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1e8.
                            super__Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_1e8.
                                  super__Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1e8.
                                  super__Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        if (local_228[0] != local_218) {
          operator_delete(local_228[0],local_218[0] + 1);
        }
      }
      else {
        cmSystemTools::Error(&local_208);
        local_22c = 1;
        bVar5 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,
                        CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                                 local_208.field_2._M_local_buf[0]) + 1);
      }
      if (!bVar5) break;
      local_248 = local_248 + 1;
      bVar13 = local_248 <
               (ulong)((long)(local_240->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_240->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 5);
    } while (bVar13);
    uVar9 = (ulong)local_22c;
    output = local_1b0;
    uVar10 = local_234;
    uVar12 = local_230;
  }
  iVar7 = (int)uVar9;
  if (!bVar13) {
    if (((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ParallelLevelSetInCli ==
        false) {
      local_1a8._M_string_length = 0;
      local_1a8.field_2._M_allocated_capacity =
           local_1a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      bVar13 = cmsys::SystemTools::GetEnv("CTEST_PARALLEL_LEVEL",&local_1a8);
      if (bVar13) {
        iVar8 = atoi(local_1a8._M_dataplus._M_p);
        iVar7 = 1;
        if (1 < iVar8) {
          iVar7 = iVar8;
        }
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ParallelLevel = iVar7;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
      }
    }
    _Var1._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    if (((_Var1._M_head_impl)->TestProgressOutput == true) &&
       ((_Var1._M_head_impl)->OutputLogFile == (cmGeneratedFileStream *)0x0)) {
      bVar13 = ConsoleIsNotDumb();
    }
    else {
      bVar13 = false;
    }
    ((this->Impl)._M_t.
     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
     super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TestProgressOutput = bVar13;
    if ((uVar12 & 1) == 0) {
      iVar7 = 1;
      if ((uVar10 & 1) != 0) {
        iVar7 = ExecuteTests(this);
      }
    }
    else {
      iVar7 = RunCMakeAndTest(this,output);
    }
  }
  return iVar7;
}

Assistant:

int cmCTest::Run(std::vector<std::string>& args, std::string* output)
{
  const char* ctestExec = "ctest";
  bool cmakeAndTest = false;
  bool executeTests = true;
  bool SRArgumentSpecified = false;

  // copy the command line
  cmAppend(this->Impl->InitialCommandLineArguments, args);

  // process the command line arguments
  for (size_t i = 1; i < args.size(); ++i) {
    // handle the simple commandline arguments
    std::string errormsg;
    if (!this->HandleCommandLineArguments(i, args, errormsg)) {
      cmSystemTools::Error(errormsg);
      return 1;
    }

    // handle the script arguments -S -SR -SP
    this->HandleScriptArguments(i, args, SRArgumentSpecified);

    // --dashboard: handle a request for a dashboard
    std::string arg = args[i];
    if (this->CheckArgument(arg, "-D", "--dashboard") && i < args.size() - 1) {
      this->Impl->ProduceXML = true;
      i++;
      std::string targ = args[i];
      // AddTestsForDashboard parses the dashboard type and converts it
      // into the separate stages
      if (!this->AddTestsForDashboardType(targ)) {
        if (!this->AddVariableDefinition(targ)) {
          this->ErrorMessageUnknownDashDValue(targ);
          executeTests = false;
        }
      }
    }

    // If it's not exactly -D, but it starts with -D, then try to parse out
    // a variable definition from it, same as CMake does. Unsuccessful
    // attempts are simply ignored since previous ctest versions ignore
    // this too. (As well as many other unknown command line args.)
    //
    if (arg != "-D" && cmSystemTools::StringStartsWith(arg.c_str(), "-D")) {
      std::string input = arg.substr(2);
      this->AddVariableDefinition(input);
    }

    // --test-action: calls SetTest(<stage>, /*report=*/ false) to enable
    // the corresponding stage
    if (!this->HandleTestActionArgument(ctestExec, i, args)) {
      executeTests = false;
    }

    // --test-model: what type of test model
    if (!this->HandleTestModelArgument(ctestExec, i, args)) {
      executeTests = false;
    }

    // --extra-submit
    if (this->CheckArgument(arg, "--extra-submit") && i < args.size() - 1) {
      this->Impl->ProduceXML = true;
      this->SetTest("Submit");
      i++;
      if (!this->SubmitExtraFiles(args[i].c_str())) {
        return 0;
      }
    }

    // --build-and-test options
    if (this->CheckArgument(arg, "--build-and-test") && i < args.size() - 1) {
      cmakeAndTest = true;
    }

    // --schedule-random
    if (this->CheckArgument(arg, "--schedule-random")) {
      this->Impl->ScheduleType = "Random";
    }

    // pass the argument to all the handlers as well, but i may no longer be
    // set to what it was originally so I'm not sure this is working as
    // intended
    for (auto& handler : this->Impl->GetTestingHandlers()) {
      if (!handler->ProcessCommandLineArguments(arg, i, args)) {
        cmCTestLog(this, ERROR_MESSAGE,
                   "Problem parsing command line arguments within a handler");
        return 0;
      }
    }
  } // the close of the for argument loop

  // handle CTEST_PARALLEL_LEVEL environment variable
  if (!this->Impl->ParallelLevelSetInCli) {
    std::string parallel;
    if (cmSystemTools::GetEnv("CTEST_PARALLEL_LEVEL", parallel)) {
      int plevel = atoi(parallel.c_str());
      this->SetParallelLevel(plevel);
    }
  }

  // TestProgressOutput only supported if console supports it and not logging
  // to a file
  this->Impl->TestProgressOutput = this->Impl->TestProgressOutput &&
    !this->Impl->OutputLogFile && this->ProgressOutputSupportedByConsole();
#ifdef _WIN32
  if (this->Impl->TestProgressOutput) {
    // Disable output line buffering so we can print content without
    // a newline.
    std::setvbuf(stdout, nullptr, _IONBF, 0);
  }
#endif

  // now what should cmake do? if --build-and-test was specified then
  // we run the build and test handler and return
  if (cmakeAndTest) {
    return this->RunCMakeAndTest(output);
  }

  if (executeTests) {
    return this->ExecuteTests();
  }

  return 1;
}